

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O1

int archive_compressor_compress_close(archive_write_filter *f)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar1 = f->data;
  iVar3 = output_code(f,*(int *)((long)pvVar1 + 0x65164));
  if (iVar3 != 0) {
    return iVar3;
  }
  pvVar2 = f->data;
  iVar3 = *(int *)((long)pvVar2 + 0x6516c) % 8;
  if (iVar3 != 0) {
    *(uint *)((long)pvVar2 + 0x18) = iVar3 + 7U >> 3;
    iVar3 = output_byte(f,*(uchar *)((long)pvVar2 + 0x65170));
    if (iVar3 != 0) goto LAB_00267c95;
  }
  iVar3 = 0;
LAB_00267c95:
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = __archive_write_filter
                    (f->next_filter,*(void **)((long)pvVar1 + 0x65178),
                     *(size_t *)((long)pvVar1 + 0x65188));
  return iVar3;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		return ret;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		return ret;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
	return (ret);
}